

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varchar_data.hpp
# Opt level: O1

void duckdb::ArrowVarcharData<duckdb::string_t,_duckdb::ArrowVarcharConverter,_long>::
     AppendTemplated<false>
               (ArrowAppendData *append_data,Vector *input,idx_t from,idx_t to,idx_t input_size)

{
  vector<duckdb::ArrowBuffer,_true> *this;
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  reference this_00;
  reference buffer;
  reference this_01;
  ulong uVar3;
  InvalidInputException *this_02;
  long lVar4;
  ulong uVar5;
  idx_t bytes;
  ulong params_1;
  void *__src;
  ulong uVar6;
  long lVar7;
  UnifiedVectorFormat format;
  string local_98;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(input,input_size,&local_78);
  this = &append_data->arrow_buffers;
  this_00 = vector<duckdb::ArrowBuffer,_true>::operator[](this,1);
  buffer = vector<duckdb::ArrowBuffer,_true>::operator[](this,0);
  this_01 = vector<duckdb::ArrowBuffer,_true>::operator[](this,2);
  lVar4 = to - from;
  ResizeValidity(buffer,append_data->row_count + lVar4);
  pdVar1 = buffer->dataptr;
  bytes = this_00->count + lVar4 * 8 + 8;
  ArrowBuffer::reserve(this_00,bytes);
  this_00->count = bytes;
  pdVar2 = this_00->dataptr;
  if (append_data->row_count == 0) {
    pdVar2[0] = '\0';
    pdVar2[1] = '\0';
    pdVar2[2] = '\0';
    pdVar2[3] = '\0';
    pdVar2[4] = '\0';
    pdVar2[5] = '\0';
    pdVar2[6] = '\0';
    pdVar2[7] = '\0';
  }
  if (from < to) {
    uVar6 = *(ulong *)(pdVar2 + append_data->row_count * 8);
    lVar7 = 0;
    do {
      if ((local_78.sel)->sel_vector == (sel_t *)0x0) {
        uVar5 = from + lVar7;
      }
      else {
        uVar5 = (ulong)(local_78.sel)->sel_vector[from + lVar7];
      }
      uVar3 = append_data->row_count + lVar7;
      if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar5 >> 6] >>
           (uVar5 & 0x3f) & 1) != 0)) {
        params_1 = *(uint *)(local_78.data + uVar5 * 0x10) + uVar6;
        if ((params_1 & 0xffffffff80000000) != 0) {
          this_02 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_98,
                     "Arrow Appender: The maximum total string size for regular string buffers is %u but the offset of %lu exceeds this.\n* SET arrow_large_buffer_size=true to use large string buffers"
                     ,"");
          InvalidInputException::InvalidInputException<int,unsigned_long>
                    (this_02,&local_98,0x7fffffff,params_1);
          __cxa_throw(this_02,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error)
          ;
        }
        *(ulong *)(pdVar2 + (uVar3 + 1) * 8) = params_1;
        ArrowBuffer::reserve(this_01,params_1);
        this_01->count = params_1;
        local_98._M_dataplus._M_p = *(pointer *)(local_78.data + uVar5 * 0x10);
        local_98._M_string_length = *(ulong *)((long)(local_78.data + uVar5 * 0x10) + 8);
        __src = (void *)local_98._M_string_length;
        if (((ulong)local_98._M_dataplus._M_p & 0xffffffff) < 0xd) {
          __src = (void *)((long)&local_98._M_dataplus._M_p + 4);
        }
        switchD_012dd528::default
                  (this_01->dataptr + uVar6,__src,(ulong)local_98._M_dataplus._M_p & 0xffffffff);
        uVar6 = params_1;
      }
      else {
        pdVar1[uVar3 >> 3] = pdVar1[uVar3 >> 3] & ~(byte)(1L << ((byte)uVar3 & 7));
        append_data->null_count = append_data->null_count + 1;
        *(ulong *)(pdVar2 + (uVar3 + 1) * 8) = uVar6;
      }
      lVar7 = lVar7 + 1;
    } while (to - from != lVar7);
  }
  append_data->row_count = append_data->row_count + lVar4;
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void AppendTemplated(ArrowAppendData &append_data, Vector &input, idx_t from, idx_t to, idx_t input_size) {
		idx_t size = to - from;
		UnifiedVectorFormat format;
		input.ToUnifiedFormat(input_size, format);
		auto &main_buffer = append_data.GetMainBuffer();
		auto &validity_buffer = append_data.GetValidityBuffer();
		auto &aux_buffer = append_data.GetAuxBuffer();

		// resize the validity mask and set up the validity buffer for iteration
		ResizeValidity(validity_buffer, append_data.row_count + size);
		auto validity_data = (uint8_t *)validity_buffer.data();

		// resize the offset buffer - the offset buffer holds the offsets into the child array
		main_buffer.resize(main_buffer.size() + sizeof(BUFTYPE) * (size + 1));
		auto data = UnifiedVectorFormat::GetData<SRC>(format);
		auto offset_data = main_buffer.GetData<BUFTYPE>();
		if (append_data.row_count == 0) {
			// first entry
			offset_data[0] = 0;
		}
		// now append the string data to the auxiliary buffer
		// the auxiliary buffer's length depends on the string lengths, so we resize as required
		auto last_offset = offset_data[append_data.row_count];
		for (idx_t i = from; i < to; i++) {
			auto source_idx = format.sel->get_index(i);
			auto offset_idx = append_data.row_count + i + 1 - from;

			if (!format.validity.RowIsValid(source_idx)) {
				uint8_t current_bit;
				idx_t current_byte;
				GetBitPosition(append_data.row_count + i - from, current_byte, current_bit);
				SetNull(append_data, validity_data, current_byte, current_bit);
				offset_data[offset_idx] = last_offset;
				continue;
			}

			auto string_length = OP::GetLength(data[source_idx]);

			// append the offset data
			auto current_offset = UnsafeNumericCast<idx_t>(last_offset) + string_length;
			if (!LARGE_STRING &&
			    UnsafeNumericCast<idx_t>(last_offset) + string_length > NumericLimits<int32_t>::Maximum()) {
				D_ASSERT(append_data.options.arrow_offset_size == ArrowOffsetSize::REGULAR);
				throw InvalidInputException(
				    "Arrow Appender: The maximum total string size for regular string buffers is "
				    "%u but the offset of %lu exceeds this.\n* SET arrow_large_buffer_size=true to use large string "
				    "buffers",
				    NumericLimits<int32_t>::Maximum(), current_offset);
			}
			offset_data[offset_idx] = UnsafeNumericCast<BUFTYPE>(current_offset);

			// resize the string buffer if required, and write the string data
			aux_buffer.resize(current_offset);
			OP::WriteData(aux_buffer.data() + last_offset, data[source_idx]);

			last_offset = UnsafeNumericCast<BUFTYPE>(current_offset);
		}
		append_data.row_count += size;
	}